

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::UniversalPrintArray<char_volatile>(char *begin,size_t N,iu_ostream *os)

{
  size_t kChunksize;
  size_t kThreshold;
  iu_ostream *os_local;
  size_t N_local;
  char *begin_local;
  
  if (N == 0) {
    std::operator<<(os,"{}");
  }
  else {
    std::operator<<(os,"{ ");
    if (N < 0x13) {
      PrintRawArrayTo<char_volatile>(begin,N,os);
    }
    else {
      PrintRawArrayTo<char_volatile>(begin,9,os);
      std::operator<<(os,", ..., ");
      PrintRawArrayTo<char_volatile>(begin + (N - 9),9,os);
    }
    std::operator<<(os," }");
  }
  return;
}

Assistant:

inline void IUTEST_ATTRIBUTE_UNUSED_ UniversalPrintArray(const T* begin, size_t N, iu_ostream* os)
{
    if( N == 0 )
    {
        *os << "{}";
    }
    else
    {
        *os << "{ ";
        const size_t kThreshold = kValues::PrintArrayThreshold;
        const size_t kChunksize = kValues::PrintArrayChunksize;
        if( N <= kThreshold )
        {
            PrintRawArrayTo(begin, N, os);
        }
        else
        {
            PrintRawArrayTo(begin, kChunksize, os);
            *os << ", ..., ";
            PrintRawArrayTo(begin + N - kChunksize, kChunksize, os);
        }
        *os << " }";
    }
}